

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O3

void __thiscall
test::spi_test::iu_SPITest_x_iutest_x_FatalFailure2_Test::~iu_SPITest_x_iutest_x_FatalFailure2_Test
          (iu_SPITest_x_iutest_x_FatalFailure2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_class_1_0_00000001 local_9;
  
  (this->super_SPITest).super_Test._vptr_Test = (_func_int **)&PTR__SPITest_003a5d28;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(this->super_SPITest).v.
              super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
              super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
              super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
              super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_> + 0x20)]._M_data
  )(&local_9,&(this->super_SPITest).v);
  *(__index_type *)
   ((long)&(this->super_SPITest).v.
           super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_> + 0x20) = 0xff;
  pcVar2 = (this->super_SPITest).sa2._M_dataplus._M_p;
  paVar1 = &(this->super_SPITest).sa2.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_SPITest).sb._M_dataplus._M_p;
  paVar1 = &(this->super_SPITest).sb.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_SPITest).sa._M_dataplus._M_p;
  paVar1 = &(this->super_SPITest).sa.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  iutest::Test::Observer<void>::s_current = (Test *)0x0;
  operator_delete(this,0x150);
  return;
}

Assistant:

IUTEST_F(SPITest, FatalFailure2)
{
    int count=0;
#if IUTEST_HAS_EXCEPTIONS
    try {
        FatalFailure2_Sub(count);
    } catch(...) {
    }
#else
    FatalFailure2_Sub(count);
#endif
    IUTEST_ASSERT_EQ(1, count);
}